

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreFilter.hpp
# Opt level: O3

void __thiscall
cppjieba::PreFilter::PreFilter
          (PreFilter *this,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *symbols,string *sentence)

{
  RuneStrArray *runes;
  bool bVar1;
  Logger local_1a0;
  
  runes = &this->sentence_;
  memset(runes,0,0x140);
  (this->sentence_).ptr_ = runes->buffer_;
  (this->sentence_).size_ = 0;
  (this->sentence_).capacity_ = 0x10;
  this->symbols_ = symbols;
  bVar1 = DecodeRunesInString((sentence->_M_dataplus)._M_p,sentence->_M_string_length,runes);
  if (!bVar1) {
    limonp::Logger::Logger
              (&local_1a0,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/include/cppjieba/PreFilter.hpp"
               ,0x15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"decode failed. ",0xf);
    limonp::Logger::~Logger(&local_1a0);
  }
  this->cursor_ = (this->sentence_).ptr_;
  return;
}

Assistant:

PreFilter(const unordered_set<Rune>& symbols, 
        const string& sentence)
    : symbols_(symbols) {
    if (!DecodeRunesInString(sentence, sentence_)) {
      XLOG(ERROR) << "decode failed. "; 
    }
    cursor_ = sentence_.begin();
  }